

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CRotationY.hpp
# Opt level: O0

void __thiscall
qclab::qgates::CRotationY<std::complex<double>_>::CRotationY
          (CRotationY<std::complex<double>_> *this)

{
  undefined4 local_14;
  CRotationY<std::complex<double>_> *local_10;
  CRotationY<std::complex<double>_> *this_local;
  
  local_10 = this;
  QControlledGate2<std::complex<double>_>::QControlledGate2
            (&this->super_QControlledGate2<std::complex<double>_>,0,1);
  (this->super_QControlledGate2<std::complex<double>_>).super_QGate2<std::complex<double>_>.
  super_QObject<std::complex<double>_>._vptr_QObject = (_func_int **)&PTR_nbQubits_0075b0d0;
  local_14 = 1;
  std::make_unique<qclab::qgates::RotationY<std::complex<double>>,int,double>
            ((int *)&this->gate_,(double *)&local_14);
  return;
}

Assistant:

CRotationY()
        : QControlledGate2< T >( 0 )
        , gate_( std::make_unique< RotationY< T > >( 1 , 0. ) )
        { }